

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O0

void mathCore::do_simplification(expression *a)

{
  expression *peVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppeVar5;
  size_type sVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  expression *peVar7;
  expression *local_50;
  expression *child_1;
  iterator iter_1;
  expression *local_20;
  expression *child;
  iterator iter;
  expression *a_local;
  
  iter._M_node = (_Base_ptr)a;
  bVar3 = is_and(a);
  if (bVar3) {
    combine_and((expression *)iter._M_node);
    child = (expression *)
            std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                      ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                       &(iter._M_node)->_M_parent);
    ppeVar5 = std::_Rb_tree_const_iterator<expression_*>::operator*
                        ((_Rb_tree_const_iterator<expression_*> *)&child);
    local_20 = *ppeVar5;
    child = (expression *)
            std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                      ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                       &(iter._M_node)->_M_parent,(const_iterator)child);
    bVar3 = is_or(local_20);
    if (bVar3) {
      peVar7 = local_20;
      absorbtion_law((expression *)iter._M_node,local_20);
      bVar3 = is_literal(local_20);
      if ((bVar3) || (bVar3 = is_var(local_20), bVar3)) {
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                  ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                   &(iter._M_node)->_M_parent,&local_20);
      }
      else {
        sVar6 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::size
                          ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                           &(iter._M_node)->_M_parent);
        iVar2 = iter;
        peVar1 = local_20;
        if (sVar6 < 2) {
          sVar6 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::size
                            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                             &(iter._M_node)->_M_parent);
          iVar2 = iter;
          peVar1 = local_20;
          if (sVar6 == 1) {
            ppeVar5 = std::_Rb_tree_const_iterator<expression_*>::operator*
                                ((_Rb_tree_const_iterator<expression_*> *)&child);
            iVar4 = copy((EVP_PKEY_CTX *)*ppeVar5,(EVP_PKEY_CTX *)peVar7);
            distributive_law((expression *)iVar2._M_node,peVar1,
                             (expression *)CONCAT44(extraout_var_00,iVar4));
          }
        }
        else {
          iVar4 = copy((EVP_PKEY_CTX *)iter._M_node,(EVP_PKEY_CTX *)peVar7);
          distributive_law((expression *)iVar2._M_node,peVar1,
                           (expression *)CONCAT44(extraout_var,iVar4));
        }
        delete_children((expression *)iter._M_node);
        iter_1 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                           ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                            &(iter._M_node)->_M_parent,&local_20);
      }
      empty_expression((expression *)iter._M_node);
    }
  }
  else {
    bVar3 = is_or((expression *)iter._M_node);
    if (bVar3) {
      combine_or((expression *)iter._M_node);
      child_1 = (expression *)
                std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                          ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                           &(iter._M_node)->_M_parent);
      ppeVar5 = std::_Rb_tree_const_iterator<expression_*>::operator*
                          ((_Rb_tree_const_iterator<expression_*> *)&child_1);
      local_50 = *ppeVar5;
      child_1 = (expression *)
                std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                          ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                           &(iter._M_node)->_M_parent,(const_iterator)child_1);
      bVar3 = is_and(local_50);
      if (bVar3) {
        peVar7 = local_50;
        absorbtion_law((expression *)iter._M_node,local_50);
        bVar3 = is_literal(local_50);
        if ((bVar3) || (bVar3 = is_var(local_50), bVar3)) {
          std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                    ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                     &(iter._M_node)->_M_parent,&local_50);
        }
        else {
          sVar6 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::size
                            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                             &(iter._M_node)->_M_parent);
          iVar2 = iter;
          peVar1 = local_50;
          if (sVar6 < 2) {
            sVar6 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::size
                              ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *
                               )&(iter._M_node)->_M_parent);
            iVar2 = iter;
            peVar1 = local_50;
            if (sVar6 == 1) {
              ppeVar5 = std::_Rb_tree_const_iterator<expression_*>::operator*
                                  ((_Rb_tree_const_iterator<expression_*> *)&child_1);
              iVar4 = copy((EVP_PKEY_CTX *)*ppeVar5,(EVP_PKEY_CTX *)peVar7);
              distributive_law((expression *)iVar2._M_node,peVar1,
                               (expression *)CONCAT44(extraout_var_02,iVar4));
            }
          }
          else {
            iVar4 = copy((EVP_PKEY_CTX *)iter._M_node,(EVP_PKEY_CTX *)peVar7);
            distributive_law((expression *)iVar2._M_node,peVar1,
                             (expression *)CONCAT44(extraout_var_01,iVar4));
          }
          delete_children((expression *)iter._M_node);
          std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                    ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                     &(iter._M_node)->_M_parent,&local_50);
        }
        empty_expression((expression *)iter._M_node);
      }
    }
  }
  return;
}

Assistant:

void mathCore::do_simplification(expression* a) {
	if (is_and(a)) {
		combine_and(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_or(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				delete_children(a);	// Remove everything from a
				a->contents.insert(child);	// Put in us!
			}
			empty_expression(a);
		}
	}
	else if (is_or(a)) {
		combine_or(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_and(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				
				delete_children(a);	// Remove everything from a
				a->contents.insert(child);
			}
			empty_expression(a);
		}
	}
}